

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_write_buffer.c
# Opt level: O3

void test_cio_write_buffer_peek_and_last(void)

{
  long ***ppplVar1;
  uint data1;
  char data2 [13];
  cio_write_buffer wb2;
  cio_write_buffer wb1;
  undefined4 local_94;
  undefined5 local_90;
  undefined3 uStack_8b;
  undefined5 uStack_88;
  long **local_80;
  long **local_78;
  undefined5 *local_70;
  undefined8 local_68;
  long **local_60;
  long **local_58;
  undefined4 *local_50;
  undefined8 local_48;
  long **local_40;
  long **local_38;
  long local_30;
  long lStack_28;
  
  local_30 = 0;
  lStack_28 = 0;
  local_40 = (long **)&local_40;
  local_38 = (long **)&local_40;
  UnityAssertEqualNumber
            (0,0,
             "Number of elements in write buffer not \'0\' after initialization of write buffer head!"
             ,0xa1,UNITY_DISPLAY_STYLE_INT);
  local_50 = &local_94;
  local_94 = 0x12;
  local_48 = 4;
  local_58 = local_38;
  local_60 = (long **)&local_40;
  *local_38 = (long *)&local_60;
  local_30 = local_30 + 1;
  lStack_28 = lStack_28 + 4;
  local_38 = (long **)&local_60;
  UnityAssertEqualNumber
            (1,local_30,
             "Number of elements in write buffer not \'1\' after inserting first element!",0xa8,
             UNITY_DISPLAY_STYLE_INT);
  local_70 = &local_90;
  uStack_88 = 0x21646c72;
  local_90 = 0x6f6c6c6548;
  uStack_8b = 0x6f5720;
  local_68 = 0xd;
  local_78 = local_38;
  local_80 = (long **)&local_40;
  *local_38 = (long *)&local_80;
  local_30 = local_30 + 1;
  lStack_28 = lStack_28 + 0xd;
  local_38 = (long **)&local_80;
  UnityAssertEqualNumber
            (2,local_30,
             "Number of elements in write buffer not \'2\' after inserting second element!",0xaf,
             UNITY_DISPLAY_STYLE_INT);
  ppplVar1 = (long ***)local_40;
  if ((long ***)local_40 == &local_40) {
    ppplVar1 = (long ***)0x0;
  }
  UnityAssertEqualNumber
            ((UNITY_INT)&local_60,(UNITY_INT)ppplVar1,
             "Peek() gave not the write buffer inserted first!",0xb2,UNITY_DISPLAY_STYLE_INT);
  UnityAssertEqualNumber
            (2,local_30,"Number of elements changed after peek()!",0xb4,UNITY_DISPLAY_STYLE_INT);
  UnityAssertEqualNumber
            (0x11,lStack_28,"Write buffer total length not correct!",0xb5,UNITY_DISPLAY_STYLE_INT);
  ppplVar1 = (long ***)local_38;
  if ((long ***)local_38 == &local_40) {
    ppplVar1 = (long ***)0x0;
  }
  UnityAssertEqualNumber
            ((UNITY_INT)&local_80,(UNITY_INT)ppplVar1,
             "Last() gave not the write buffer inserted last!",0xb8,UNITY_DISPLAY_STYLE_INT);
  UnityAssertEqualNumber
            (2,local_30,"Number of elements changed after last()!",0xba,UNITY_DISPLAY_STYLE_INT);
  UnityAssertEqualNumber
            (0x11,lStack_28,"Write buffer total length not correct!",0xbb,UNITY_DISPLAY_STYLE_INT);
  return;
}

Assistant:

static void test_cio_write_buffer_peek_and_last(void)
{
	struct cio_write_buffer wbh;
	cio_write_buffer_head_init(&wbh);
	size_t num_elements = cio_write_buffer_get_num_buffer_elements(&wbh);
	TEST_ASSERT_EQUAL_MESSAGE(0, num_elements, "Number of elements in write buffer not '0' after initialization of write buffer head!");

	unsigned int data1 = 0x12;
	struct cio_write_buffer wb1;
	cio_write_buffer_element_init(&wb1, &data1, sizeof(data1));
	cio_write_buffer_queue_tail(&wbh, &wb1);
	num_elements = cio_write_buffer_get_num_buffer_elements(&wbh);
	TEST_ASSERT_EQUAL_MESSAGE(1, num_elements, "Number of elements in write buffer not '1' after inserting first element!");

	const char data2[] = "Hello World!";
	struct cio_write_buffer wb2;
	cio_write_buffer_const_element_init(&wb2, data2, sizeof(data2));
	cio_write_buffer_queue_tail(&wbh, &wb2);
	num_elements = cio_write_buffer_get_num_buffer_elements(&wbh);
	TEST_ASSERT_EQUAL_MESSAGE(2, num_elements, "Number of elements in write buffer not '2' after inserting second element!");

	struct cio_write_buffer *peek = cio_write_buffer_queue_peek(&wbh);
	TEST_ASSERT_EQUAL_MESSAGE(&wb1, peek, "Peek() gave not the write buffer inserted first!");
	num_elements = cio_write_buffer_get_num_buffer_elements(&wbh);
	TEST_ASSERT_EQUAL_MESSAGE(2, num_elements, "Number of elements changed after peek()!");
	TEST_ASSERT_EQUAL_MESSAGE(sizeof(data1) + sizeof(data2), cio_write_buffer_get_total_size(&wbh), "Write buffer total length not correct!");

	struct cio_write_buffer *last = cio_write_buffer_queue_last(&wbh);
	TEST_ASSERT_EQUAL_MESSAGE(&wb2, last, "Last() gave not the write buffer inserted last!");
	num_elements = cio_write_buffer_get_num_buffer_elements(&wbh);
	TEST_ASSERT_EQUAL_MESSAGE(2, num_elements, "Number of elements changed after last()!");
	TEST_ASSERT_EQUAL_MESSAGE(sizeof(data1) + sizeof(data2), cio_write_buffer_get_total_size(&wbh), "Write buffer total length not correct!");
}